

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticLine>::CreateBCGeoEl
          (TPZGeoElRefLess<pzgeom::TPZQuadraticLine> *this,int side,int bc)

{
  undefined1 auVar1 [16];
  MElementType MVar2;
  ostream *poVar3;
  TPZGeoEl *pTVar4;
  ulong uVar5;
  uint uVar6;
  int64_t size;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  TPZManVector<int,_27> mapside;
  TPZStack<int,_10> LowAllSides;
  TPZManVector<int,_27> local_100;
  TPZManVector<int,_10> local_70;
  long lVar9;
  
  if ((uint)side < 3) {
    MVar2 = pztopology::TPZLine::Type(side);
    pztopology::TPZLine::NSideNodes(side);
    switch(MVar2) {
    case EPoint:
      size = 1;
      break;
    case EOned:
      size = 3;
      break;
    case ETriangle:
      size = 7;
      break;
    case EQuadrilateral:
      size = 9;
      break;
    default:
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
                 ,0x124);
    }
    local_70.super_TPZVec<int>._vptr_TPZVec._0_4_ = 0;
    TPZManVector<int,_27>::TPZManVector(&local_100,size,(int *)&local_70);
    auVar1 = _DAT_014f8350;
    uVar6 = (int)size + (uint)((int)size == 0);
    lVar9 = (ulong)uVar6 - 1;
    auVar7._8_4_ = (int)lVar9;
    auVar7._0_8_ = lVar9;
    auVar7._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar5 = 0;
    auVar7 = auVar7 ^ _DAT_014f8350;
    auVar8 = _DAT_014f8340;
    do {
      auVar10 = auVar8 ^ auVar1;
      if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                  auVar7._4_4_ < auVar10._4_4_) & 1)) {
        local_100.super_TPZVec<int>.fStore[uVar5] = (int)uVar5;
      }
      if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
          auVar10._12_4_ <= auVar7._12_4_) {
        local_100.super_TPZVec<int>.fStore[uVar5 + 1] = (int)uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
    } while ((uVar6 + 1 & 0x1e) != uVar5);
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_70);
    pztopology::TPZLine::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_70);
    TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_70,side);
    pTVar4 = (TPZGeoEl *)
             (**(code **)(*(long *)&this->super_TPZGeoEl + 0x2e0))(this,side,bc,&local_100);
    TPZManVector<int,_10>::~TPZManVector(&local_70);
    if (local_100.super_TPZVec<int>.fStore == local_100.fExtAlloc) {
      local_100.super_TPZVec<int>.fStore = (int *)0x0;
    }
    local_100.super_TPZVec<int>.fNAlloc = 0;
    local_100.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_100.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_100.super_TPZVec<int>.fStore);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n (",3);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,")::CreateBCGeoEl unexpected side = ",0x23);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,side);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    pTVar4 = (TPZGeoEl *)0x0;
  }
  return pTVar4;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::CreateBCGeoEl(int side, int bc){
	// Consistency check
	int nsides = TGeo::NSides;
	if(side<0 || side >= nsides){
		std::cout << "\n ("<<TGeo::Type()<<")::CreateBCGeoEl unexpected side = " << side << "\n";
		return 0;
	}
	if(fGeo.Dimension == 3 && side == nsides-1){
		std::cout <<"\nCreateBCGeoEl not implemented for tridimensional sides \n";
		return 0;
	}
    
    // the side orientation will be +1 if the side is oriented counterclockwise
    // -1 if the side is clockwise
    
    
    int faceSide = 0;
    if (fGeo.Dimension == 2){
        faceSide = side - TGeo::NCornerNodes;
    } else if (fGeo.Dimension == 3){
        faceSide = side - TGeo::NCornerNodes - TGeo::NumSides(1);
    }

    int sideorient = 1;
    switch (TGeo::Type())
    {
    case ETriangle:
        sideorient = pztopology::TPZTriangle::GetSideOrient(faceSide);
        break;
    case EQuadrilateral:
        sideorient = pztopology::TPZQuadrilateral::GetSideOrient(faceSide);
        break;
    case ETetraedro:
        sideorient = pztopology::TPZTetrahedron::GetSideOrient(faceSide);
        break;
    case ECube:
        sideorient = pztopology::TPZCube::GetSideOrient(faceSide);
        break;
    case EPrisma:
        sideorient = pztopology::TPZPrism::GetSideOrient(faceSide);
        break;
    
    default:
        break;
    }
    
    
    // Build vector with node indices of element to be created
    MElementType sidetype = TGeo::Type(side);
    int sidennodes = TGeo::NSideNodes(side);
    int sizeMap = 0;
    switch (sidetype){
    case EPoint:
        sizeMap = 1;
        break;
    case EOned:
        sizeMap = 3;
        break;
    case ETriangle:
        sizeMap = 7;
        break;
    case EQuadrilateral:
        sizeMap = 9;
        break;
    default:
        DebugStop();
    }

    TPZManVector<int,27> mapside(sizeMap,0);
    for(int i=0; i<sizeMap; i++) mapside[i] = i;
    
    if(sideorient == -1)
    {
        switch(sidetype){
            case EOned:
                mapside = {1,0,2};
                break;
            case ETriangle:
                mapside = {0,2,1,5,4,3,6};
                break;
            case EQuadrilateral:
                mapside = {0,3,2,1,7,6,5,4,8};
            default:
                break;
        }
    }

	// Is side straight?
	TPZStack<int> LowAllSides;
	TGeo::LowerDimensionSides(side,LowAllSides);
    LowAllSides.Push(side);
	bool straight = true;
    if(fGeo.IsLinearMapping(side) == false) straight = false;
	for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
	{
		int lside = LowAllSides[lowside]; 
		if(lside < TGeo::NNodes) continue;
		if(fGeo.IsLinearMapping(lside) == false) straight = false;
		if(straight == false) break;
	}
	if(straight == false)
	{
		TPZGeoEl *BCGeoEl = CreateBCGeoBlendEl(side,bc,mapside);
		return BCGeoEl;
	}
	
	// else

	TPZManVector<int64_t,4> nodeindices(sidennodes);
	for(int inode = 0; inode < sidennodes; inode++){
        int orientednode = inode;
        if(sideorient == -1) orientednode = mapside[inode];
		nodeindices[orientednode] = this->SideNodeIndex(side,inode);
	}

	// Create GeoElement
	int64_t index;
	MElementType BCtype = TGeo::Type(side);
	TPZGeoEl *BCGeoEl = this->Mesh()->CreateGeoElement(BCtype, nodeindices, bc, index);

    TPZGeoElSide BCGelside(BCGeoEl);
    TPZGeoElSide thisside(this,side);
    BCGelside.InsertConnectivity(thisside,mapside);
    /*
	// Set Connectivity
	int sidensides = TGeo::NContainedSides(side);
	for(int iside=0; iside < sidensides-1; iside++){
		TPZGeoElSide(BCGeoEl,mapside[iside]).SetConnectivity(TPZGeoElSide(this,TGeo::ContainedSideLocId(side,iside)));
	}
	TPZGeoElSide(BCGeoEl, sidensides-1).SetConnectivity(TPZGeoElSide(this,side));
*/
	// Return pointer to new element
	BCGeoEl->Initialize();
	return BCGeoEl;  
}